

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  Result RVar1;
  undefined8 in_RAX;
  uint uVar2;
  Enum EVar3;
  uint64_t uVar4;
  undefined8 uStack_38;
  uint32_t digit;
  
  EVar3 = Error;
  if (s != end) {
    if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
      s = s + 2;
      if (s == end) {
        return (Result)Error;
      }
      uVar4 = 0;
      uStack_38 = in_RAX;
      for (; s < end; s = s + 1) {
        if (*s != '_') {
          RVar1 = ParseHexdigit(*s,&digit);
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          if (0xfffffffffffffff < uVar4) {
            return (Result)Error;
          }
          if (uVar4 == 0xfffffffffffffff && 0xf < digit) {
            return (Result)Error;
          }
          uVar4 = uVar4 * 0x10 + (ulong)digit;
        }
      }
    }
    else {
      uVar4 = 0;
      for (; s < end; s = s + 1) {
        if (*s != 0x5f) {
          uVar2 = (int)*s - 0x30;
          if (9 < uVar2) {
            return (Result)Error;
          }
          if (0x1999999999999999 < uVar4) {
            return (Result)Error;
          }
          if (uVar4 == 0x1999999999999999 && 5 < uVar2) {
            return (Result)Error;
          }
          uVar4 = uVar4 * 10 + (ulong)uVar2;
        }
      }
    }
    if (s == end) {
      *out = uVar4;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    constexpr uint64_t kMaxDiv16 = UINT64_MAX / 16;
    constexpr uint64_t kMaxMod16 = UINT64_MAX % 16;
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      // Check for overflow.
      if (value > kMaxDiv16 || (value == kMaxDiv16 && digit > kMaxMod16)) {
        return Result::Error;
      }
      value = value * 16 + digit;
    }
  } else {
    constexpr uint64_t kMaxDiv10 = UINT64_MAX / 10;
    constexpr uint64_t kMaxMod10 = UINT64_MAX % 10;
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      // Check for overflow.
      if (value > kMaxDiv10 || (value == kMaxDiv10 && digit > kMaxMod10)) {
        return Result::Error;
      }
      value = value * 10 + digit;
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}